

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O0

void __thiscall SSTable::writeToDisk(SSTable *this,path *dst_file)

{
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *this_00;
  vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_> *this_01;
  bool bVar1;
  reference s;
  reference s_00;
  SSTableIndexItem *item_1;
  iterator __end1_1;
  iterator __begin1_1;
  SSTableIndex *__range1_1;
  SSTableDataEntry *item;
  iterator __end1;
  iterator __begin1;
  SSTableData *__range1;
  undefined1 local_218 [8];
  ofstream os;
  path *dst_file_local;
  SSTable *this_local;
  
  create_binary_ofstream((path *)local_218);
  operator<<((ofstream *)local_218,this->header);
  this_00 = this->data;
  __end1 = std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::begin(this_00);
  item = (SSTableDataEntry *)
         std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
                                *)&item);
    if (!bVar1) break;
    s = __gnu_cxx::
        __normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
        ::operator*(&__end1);
    operator<<((ofstream *)local_218,s);
    __gnu_cxx::
    __normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
    ::operator++(&__end1);
  }
  this_01 = this->index;
  __end1_1 = std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::begin(this_01);
  item_1 = (SSTableIndexItem *)
           std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<SSTableIndexItem_*,_std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>_>
                        *)&item_1);
    if (!bVar1) break;
    s_00 = __gnu_cxx::
           __normal_iterator<SSTableIndexItem_*,_std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>_>
           ::operator*(&__end1_1);
    operator<<((ofstream *)local_218,s_00);
    __gnu_cxx::
    __normal_iterator<SSTableIndexItem_*,_std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>_>
    ::operator++(&__end1_1);
  }
  std::ostream::flush();
  std::ofstream::close();
  std::filesystem::__cxx11::path::operator=(&this->file,dst_file);
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void SSTable::writeToDisk(const path &dst_file) {
    auto os = create_binary_ofstream(dst_file);
    os << *header;
    for (const auto &item:*data) {
        os << item;
    }
    for (const auto &item:*index) {
        os << item;
    }
    os.flush();
    os.close();
    file = dst_file; // Make connection between SSTable object and disk file.
}